

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O3

int ll_insert_head(ll_head *q_head,ll_elem *n,int wait)

{
  atomic_size_t *paVar1;
  atomic_size_t aVar2;
  int iVar3;
  ll_elem *plVar4;
  ulong uVar5;
  ulong uVar6;
  ll_elem *plVar7;
  bool bVar8;
  
  if (((ulong)q_head & 3) != 0) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x451,
                  "int ll_insert_head(struct ll_head *, struct ll_elem *, int)");
  }
  plVar7 = (ll_elem *)((ulong)n & 0xfffffffffffffffc);
  if (plVar7 != n) {
    __assert_fail("n == ptr_clear(n)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x452,
                  "int ll_insert_head(struct ll_head *, struct ll_elem *, int)");
  }
  if (wait == 0) {
    uVar5 = 0;
    while( true ) {
      LOCK();
      uVar6 = n->succ;
      bVar8 = uVar5 == uVar6;
      if (bVar8) {
        n->succ = uVar5 | 2;
        uVar6 = uVar5;
      }
      UNLOCK();
      if (bVar8) break;
      uVar5 = uVar6;
      if (1 < uVar6) {
        return 0;
      }
    }
    uVar5 = n->pred;
    while (1 < uVar5) {
      uVar5 = n->pred;
    }
  }
  else {
    unlink_release((ll_head *)n,(ll_elem *)0x1,wait);
  }
  LOCK();
  plVar7->refcnt = plVar7->refcnt + 1;
  UNLOCK();
  do {
    plVar4 = succ(q_head,&q_head->q);
    plVar4 = (ll_elem *)((ulong)plVar4 & 0xfffffffffffffffc);
    iVar3 = insert_between(q_head,n,&q_head->q,plVar4);
    if (iVar3 != 0) {
      LOCK();
      paVar1 = &plVar4->refcnt;
      aVar2 = *paVar1;
      *paVar1 = *paVar1 - 1;
      UNLOCK();
      if (aVar2 != 0) {
        LOCK();
        paVar1 = &plVar7->refcnt;
        aVar2 = *paVar1;
        *paVar1 = *paVar1 - 1;
        UNLOCK();
        if (aVar2 != 0) {
          return 1;
        }
      }
      break;
    }
    LOCK();
    paVar1 = &plVar4->refcnt;
    aVar2 = *paVar1;
    *paVar1 = *paVar1 - 1;
    UNLOCK();
  } while (aVar2 != 0);
  __assert_fail("old >= count",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x9a,
                "void deref_release(struct ll_head *, struct ll_elem *, size_t)");
}

Assistant:

int
ll_insert_head(struct ll_head *q_head, struct ll_elem *n, int wait)
{
	struct ll_elem	*q, *s;

	q = &q_head->q;
	assert(q == ptr_clear(q));
	assert(n == ptr_clear(n));

	/*
	 * Mark n for insert.  If this fails, n is either on a queue or
	 * being inserted/deleted.
	 *
	 * Required that n is properly initialized.
	 */
	if (wait)
		unlink_release(q_head, n, 1);
	else if (!insert_lock(n))
		return 0;
	deref_acquire(n, 1);

	s = ptr_clear(succ(q_head, q));

	/*
	 * We now have:
	 * - q -- the predecessor of the insert position
	 * - s -- the successor of the insert position
	 * - n -- the node we need to insert between p and s
	 *
	 * Note that both s may be deleted by the time we read this
	 * comment.
	 */
	while (!insert_between(q_head, n, q, s)) {
		/*
		 * Insert failed.
		 * This means s is no longer suitable.
		 */

		/* Re-resolve s. */
		deref_release(q_head, s, 1);
		s = ptr_clear(succ(q_head, q));
	}

	/*
	 * We have succesfully inserted n.  Release our reference on n and s.
	 */
	deref_release(q_head, s, 1);
	deref_release(q_head, n, 1);
	return 1;
}